

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrt.cpp
# Opt level: O3

void pbrt::CleanupPBRT(void)

{
  bool bVar1;
  function<void_()> local_28;
  
  local_28.super__Function_base._M_functor._8_8_ = 0;
  local_28.super__Function_base._M_functor._M_unused._M_object = ReportThreadStats;
  local_28._M_invoker = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
  local_28.super__Function_base._M_manager = std::_Function_handler<void_(),_void_(*)()>::_M_manager
  ;
  ForEachThread(&local_28);
  if (local_28.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_28.super__Function_base._M_manager)
              ((_Any_data *)&local_28,(_Any_data *)&local_28,__destroy_functor);
  }
  if (*(char *)(Options + 10) == '\x01') {
    StatsWritePixelImages();
  }
  if (*(char *)(Options + 9) == '\0') {
    PrintStats(_stdout);
    ClearStats();
  }
  bVar1 = PrintCheckRare(_stdout);
  if (!bVar1) {
    if (*(long *)(Options + 0xb0) != 0) {
      DisconnectFromDisplayServer();
    }
    ParallelCleanup();
    Options = 0;
    return;
  }
  ErrorExit<>("CHECK_RARE failures");
}

Assistant:

void CleanupPBRT() {
    ForEachThread(ReportThreadStats);

    if (Options->recordPixelStatistics)
        StatsWritePixelImages();

    if (!Options->quiet) {
        PrintStats(stdout);
        ClearStats();
    }
    if (PrintCheckRare(stdout))
        ErrorExit("CHECK_RARE failures");

    if (!Options->displayServer.empty())
        DisconnectFromDisplayServer();

    // API Cleanup
    ParallelCleanup();

    // CO    delete Options;
    Options = nullptr;
}